

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ITypeReader.cpp
# Opt level: O0

void __thiscall ITypeReader::getWord(ITypeReader *this,string *str)

{
  string *psVar1;
  string *psVar2;
  bool bVar3;
  char *pcVar4;
  ulong uVar5;
  string local_60 [32];
  string local_40 [39];
  char local_19;
  string *psStack_18;
  char tempChar;
  string *str_local;
  ITypeReader *this_local;
  
  psStack_18 = str;
  str_local = (string *)this;
  while (local_19 = std::istream::get(), local_19 != -1) {
    bVar3 = IDictionary::isLetterOrNumberOrDL(local_19);
    if (!bVar3) goto LAB_001149b9;
    std::__cxx11::string::operator+=((string *)psStack_18,local_19);
  }
LAB_00114a25:
  while( true ) {
    psVar1 = psStack_18;
    std::__cxx11::string::length();
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)psVar1);
    bVar3 = IDictionary::isBlankSep(*pcVar4);
    psVar2 = (string *)psStack_18;
    if (!bVar3) break;
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)local_40,(ulong)psVar2);
    std::__cxx11::string::operator=((string *)psStack_18,local_40);
    std::__cxx11::string::~string(local_40);
  }
  std::__cxx11::string::string(local_60,(string *)psStack_18);
  bVar3 = IDictionary::isBaseType((string *)local_60);
  std::__cxx11::string::~string(local_60);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    std::__cxx11::string::operator=((string *)psStack_18,"");
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    std::__cxx11::string::operator=((string *)&this->m_last,(string *)psStack_18);
  }
  return;
LAB_001149b9:
  while (bVar3 = IDictionary::isBlankSep(local_19), bVar3 || local_19 == '*') {
    std::__cxx11::string::operator+=((string *)psStack_18,local_19);
    if (local_19 == '\n') {
      std::__cxx11::string::operator+=((string *)psStack_18,'\n');
    }
    local_19 = std::istream::get();
  }
  goto LAB_00114a25;
}

Assistant:

void ITypeReader::getWord(std::string &str) {
    char tempChar;

    while((tempChar = this->m_ifs->get()) != EOF)
    {
        if(IDictionary::isLetterOrNumberOrDL(tempChar))
        {
            str+=tempChar;
        }
        else
        {
            while(IDictionary::isBlankSep(tempChar)||tempChar=='*')
            {
                str+=tempChar;
                if(tempChar=='\n')
                    str+='\n';
                tempChar = this->m_ifs->get();
            }
            break;
        }
    }
    while(IDictionary::isBlankSep(str[str.length()-1]))
        str=str.substr(0,str.length()-1);

    if(!IDictionary::isBaseType(str))
    {
        str="";
    }

    if(!str.empty())
    {
        m_last=str;
    }
}